

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<4,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  Geometry *pGVar10;
  RTCIntersectArguments *pRVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  AABBNodeMB4D *node1;
  ulong uVar30;
  uint uVar31;
  long lVar33;
  byte bVar34;
  byte bVar35;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  ulong uVar46;
  long lVar47;
  ulong uVar48;
  byte bVar49;
  ulong uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar57;
  StackItemT<embree::NodeRefPtr<4>_> SVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  float fVar83;
  float fVar85;
  float fVar86;
  undefined1 auVar84 [16];
  float fVar87;
  undefined4 uVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 in_ZMM27 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  int local_1174;
  RayQueryContext *local_1170;
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  Geometry *local_1128;
  Scene *local_1120;
  long local_1118;
  long local_1110;
  StackItemT<embree::NodeRefPtr<4>_> *local_1108;
  long local_1100;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  float local_1098;
  undefined8 local_1078;
  undefined8 uStack_1070;
  vfloat<4> tNear;
  float local_1018 [4];
  float local_1008 [4];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined8 local_f88;
  undefined8 uStack_f80;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar32;
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    local_1108 = stack + 1;
    stack[0].dist = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar51 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
    auVar98 = ZEXT1664(auVar51);
    auVar52 = vmaxss_avx512f(auVar51,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    fVar83 = (ray->super_RayK<1>).tfar;
    auVar81 = ZEXT464((uint)fVar83);
    auVar53._8_4_ = 0x7fffffff;
    auVar53._0_8_ = 0x7fffffff7fffffff;
    auVar53._12_4_ = 0x7fffffff;
    auVar53 = vandps_avx512vl((undefined1  [16])aVar2,auVar53);
    auVar60._8_4_ = 0x219392ef;
    auVar60._0_8_ = 0x219392ef219392ef;
    auVar60._12_4_ = 0x219392ef;
    uVar50 = vcmpps_avx512vl(auVar53,auVar60,1);
    bVar12 = (bool)((byte)uVar50 & 1);
    auVar55._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * (int)aVar2.x;
    bVar12 = (bool)((byte)(uVar50 >> 1) & 1);
    auVar55._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * (int)aVar2.y;
    bVar12 = (bool)((byte)(uVar50 >> 2) & 1);
    auVar55._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * (int)aVar2.z;
    bVar12 = (bool)((byte)(uVar50 >> 3) & 1);
    auVar55._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * aVar2.field_3.a;
    auVar53 = vrcp14ps_avx512vl(auVar55);
    auVar54._8_4_ = 0x3f800000;
    auVar54._0_8_ = 0x3f8000003f800000;
    auVar54._12_4_ = 0x3f800000;
    auVar54 = vfnmadd213ps_avx512vl(auVar55,auVar53,auVar54);
    auVar55 = vmaxss_avx512f(auVar51,ZEXT416((uint)fVar83));
    vfmadd132ps_fma(auVar54,auVar53,auVar53);
    auVar53 = vucomiss_avx512f(auVar51);
    auVar54 = vbroadcastss_avx512vl(auVar53);
    auVar99 = ZEXT1664(auVar54);
    vmovshdup_avx(auVar53);
    auVar54 = vshufps_avx512vl(auVar53,auVar53,0x55);
    auVar100 = ZEXT1664(auVar54);
    vshufpd_avx(auVar53,auVar53,1);
    auVar54 = vshufps_avx512vl(auVar53,auVar53,0xaa);
    auVar101 = ZEXT1664(auVar54);
    auVar73._0_4_ = auVar53._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar73._4_4_ = auVar53._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar73._8_4_ = auVar53._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar73._12_4_ = auVar53._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    auVar53 = vshufps_avx(auVar73,auVar73,0x55);
    auVar54 = vshufps_avx(auVar73,auVar73,0xaa);
    lVar45 = 0;
    vucomiss_avx512f(auVar51);
    lVar47 = 0x20;
    vucomiss_avx512f(auVar51);
    auVar51 = vbroadcastss_avx512vl(auVar52);
    auVar102 = ZEXT1664(auVar51);
    uVar88 = auVar55._0_4_;
    auVar79 = ZEXT1664(CONCAT412(uVar88,CONCAT48(uVar88,CONCAT44(uVar88,uVar88))));
    uVar50 = CONCAT44(auVar73._0_4_,auVar73._0_4_);
    local_f98._0_8_ = uVar50 ^ 0x8000000080000000;
    local_f98._8_4_ = -auVar73._0_4_;
    local_f98._12_4_ = -auVar73._0_4_;
    auVar92 = ZEXT1664(local_f98);
    local_fa8._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
    local_fa8._8_4_ = auVar53._8_4_ ^ 0x80000000;
    local_fa8._12_4_ = auVar53._12_4_ ^ 0x80000000;
    auVar94 = ZEXT1664(local_fa8);
    local_fb8._0_8_ = auVar54._0_8_ ^ 0x8000000080000000;
    local_fb8._8_4_ = auVar54._8_4_ ^ 0x80000000;
    local_fb8._12_4_ = auVar54._12_4_ ^ 0x80000000;
    auVar95 = ZEXT1664(local_fb8);
    local_1170 = context;
    local_1110 = 0;
    local_1118 = 0x20;
LAB_01bd7625:
    if (local_1108 != stack) {
      pSVar29 = local_1108 + -1;
      local_1108 = local_1108 + -1;
      if ((float)pSVar29->dist <= auVar81._0_4_) {
        uVar50 = (local_1108->ptr).ptr;
        while ((uVar50 & 8) == 0) {
          uVar30 = uVar50 & 0xfffffffffffffff0;
          uVar88 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar52._4_4_ = uVar88;
          auVar52._0_4_ = uVar88;
          auVar52._8_4_ = uVar88;
          auVar52._12_4_ = uVar88;
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x80 + lVar45),auVar52,
                                    *(undefined1 (*) [16])(uVar30 + 0x20 + lVar45));
          auVar54 = vfmadd213ps_avx512vl(auVar53,auVar99._0_16_,auVar92._0_16_);
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x80 + lVar47),auVar52,
                                    *(undefined1 (*) [16])(uVar30 + 0x20 + lVar47));
          auVar51 = vmaxps_avx512vl(auVar102._0_16_,auVar54);
          auVar54 = vfmadd213ps_avx512vl(auVar53,auVar100._0_16_,auVar94._0_16_);
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xc0),auVar52,
                                    *(undefined1 (*) [16])(uVar30 + 0x60));
          auVar53 = vfmadd213ps_avx512vl(auVar53,auVar101._0_16_,auVar95._0_16_);
          auVar53 = vmaxps_avx(auVar54,auVar53);
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x90),auVar52,
                                    *(undefined1 (*) [16])(uVar30 + 0x30));
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar51,auVar53)
          ;
          auVar53 = vfmadd213ps_avx512vl(auVar54,auVar99._0_16_,auVar92._0_16_);
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xb0),auVar52,
                                    *(undefined1 (*) [16])(uVar30 + 0x50));
          auVar53 = vminps_avx(auVar79._0_16_,auVar53);
          auVar51 = vfmadd213ps_avx512vl(auVar54,auVar100._0_16_,auVar94._0_16_);
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0xd0),auVar52,
                                    *(undefined1 (*) [16])(uVar30 + 0x70));
          auVar54 = vfmadd213ps_avx512vl(auVar54,auVar101._0_16_,auVar95._0_16_);
          auVar54 = vminps_avx(auVar51,auVar54);
          auVar53 = vminps_avx(auVar53,auVar54);
          uVar21 = vcmpps_avx512vl((undefined1  [16])tNear.field_0,auVar53,2);
          uVar31 = (uint)uVar21;
          if (((uint)uVar50 & 7) == 6) {
            uVar22 = vcmpps_avx512vl(auVar52,*(undefined1 (*) [16])(uVar30 + 0xf0),1);
            uVar23 = vcmpps_avx512vl(auVar52,*(undefined1 (*) [16])(uVar30 + 0xe0),0xd);
            uVar31 = (uint)(byte)((byte)uVar22 & (byte)uVar23 & (byte)uVar21);
          }
          if ((byte)uVar31 == 0) {
            auVar53 = vmovshdup_avx(*(undefined1 (*) [16])
                                     ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc));
            auVar81 = ZEXT1664(auVar53);
            goto LAB_01bd7625;
          }
          lVar37 = 0;
          for (uVar50 = (ulong)(byte)uVar31; (uVar50 & 1) == 0;
              uVar50 = uVar50 >> 1 | 0x8000000000000000) {
            lVar37 = lVar37 + 1;
          }
          uVar50 = *(ulong *)(uVar30 + lVar37 * 8);
          uVar31 = (uVar31 & 0xff) - 1 & uVar31 & 0xff;
          uVar32 = (ulong)uVar31;
          if (uVar31 != 0) {
            uVar9 = tNear.field_0.i[lVar37];
            lVar37 = 0;
            for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
              lVar37 = lVar37 + 1;
            }
            uVar31 = uVar31 - 1 & uVar31;
            uVar38 = (ulong)uVar31;
            uVar32 = *(ulong *)(uVar30 + lVar37 * 8);
            uVar36 = tNear.field_0.i[lVar37];
            if (uVar31 == 0) {
              if (uVar9 < uVar36) {
                (local_1108->ptr).ptr = uVar32;
                local_1108->dist = uVar36;
                local_1108 = local_1108 + 1;
              }
              else {
                (local_1108->ptr).ptr = uVar50;
                local_1108->dist = uVar9;
                uVar50 = uVar32;
                local_1108 = local_1108 + 1;
              }
            }
            else {
              auVar51._8_8_ = 0;
              auVar51._0_8_ = uVar50;
              auVar53 = vpunpcklqdq_avx(auVar51,ZEXT416(uVar9));
              auVar62._8_8_ = 0;
              auVar62._0_8_ = uVar32;
              auVar54 = vpunpcklqdq_avx(auVar62,ZEXT416(uVar36));
              lVar37 = 0;
              for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                lVar37 = lVar37 + 1;
              }
              uVar31 = uVar31 - 1 & uVar31;
              uVar50 = (ulong)uVar31;
              auVar71._8_8_ = 0;
              auVar71._0_8_ = *(ulong *)(uVar30 + lVar37 * 8);
              auVar73 = vpunpcklqdq_avx(auVar71,ZEXT416((uint)tNear.field_0.i[lVar37]));
              auVar51 = vpshufd_avx(auVar53,0xaa);
              auVar52 = vpshufd_avx(auVar54,0xaa);
              auVar55 = vpshufd_avx(auVar73,0xaa);
              if (uVar31 == 0) {
                uVar50 = vpcmpgtd_avx512vl(auVar52,auVar51);
                uVar50 = uVar50 & 0xf;
                auVar52 = vpblendmd_avx512vl(auVar54,auVar53);
                bVar12 = (bool)((byte)uVar50 & 1);
                auVar68._0_4_ = (uint)bVar12 * auVar52._0_4_ | (uint)!bVar12 * auVar51._0_4_;
                bVar12 = (bool)((byte)(uVar50 >> 1) & 1);
                auVar68._4_4_ = (uint)bVar12 * auVar52._4_4_ | (uint)!bVar12 * auVar51._4_4_;
                bVar12 = (bool)((byte)(uVar50 >> 2) & 1);
                auVar68._8_4_ = (uint)bVar12 * auVar52._8_4_ | (uint)!bVar12 * auVar51._8_4_;
                bVar12 = SUB81(uVar50 >> 3,0);
                auVar68._12_4_ = (uint)bVar12 * auVar52._12_4_ | (uint)!bVar12 * auVar51._12_4_;
                auVar54 = vmovdqa32_avx512vl(auVar54);
                bVar12 = (bool)((byte)uVar50 & 1);
                auVar69._0_4_ = (uint)bVar12 * auVar54._0_4_ | (uint)!bVar12 * auVar53._0_4_;
                bVar12 = (bool)((byte)(uVar50 >> 1) & 1);
                auVar69._4_4_ = (uint)bVar12 * auVar54._4_4_ | (uint)!bVar12 * auVar53._4_4_;
                bVar12 = (bool)((byte)(uVar50 >> 2) & 1);
                auVar69._8_4_ = (uint)bVar12 * auVar54._8_4_ | (uint)!bVar12 * auVar53._8_4_;
                bVar12 = SUB81(uVar50 >> 3,0);
                auVar69._12_4_ = (uint)bVar12 * auVar54._12_4_ | (uint)!bVar12 * auVar53._12_4_;
                auVar53 = vpshufd_avx(auVar68,0xaa);
                uVar30 = vpcmpgtd_avx512vl(auVar55,auVar53);
                uVar30 = uVar30 & 0xf;
                auVar54 = vpblendmd_avx512vl(auVar73,auVar68);
                bVar12 = (bool)((byte)uVar30 & 1);
                bVar13 = (bool)((byte)(uVar30 >> 1) & 1);
                uVar50 = CONCAT44((uint)bVar13 * auVar54._4_4_ | (uint)!bVar13 * auVar53._4_4_,
                                  (uint)bVar12 * auVar54._0_4_ | (uint)!bVar12 * auVar53._0_4_);
                auVar53 = vmovdqa32_avx512vl(auVar73);
                bVar12 = (bool)((byte)uVar30 & 1);
                auVar56._0_4_ = (uint)bVar12 * auVar53._0_4_ | !bVar12 * auVar68._0_4_;
                bVar12 = (bool)((byte)(uVar30 >> 1) & 1);
                auVar56._4_4_ = (uint)bVar12 * auVar53._4_4_ | !bVar12 * auVar68._4_4_;
                bVar12 = (bool)((byte)(uVar30 >> 2) & 1);
                auVar56._8_4_ = (uint)bVar12 * auVar53._8_4_ | !bVar12 * auVar68._8_4_;
                bVar12 = SUB81(uVar30 >> 3,0);
                auVar56._12_4_ = (uint)bVar12 * auVar53._12_4_ | !bVar12 * auVar68._12_4_;
                auVar53 = vpshufd_avx(auVar56,0xaa);
                auVar54 = vpshufd_avx(auVar69,0xaa);
                uVar30 = vpcmpgtd_avx512vl(auVar53,auVar54);
                uVar30 = uVar30 & 0xf;
                auVar54 = vpblendmd_avx512vl(auVar56,auVar69);
                bVar12 = (bool)((byte)uVar30 & 1);
                bVar14 = (bool)((byte)(uVar30 >> 1) & 1);
                bVar16 = (bool)((byte)(uVar30 >> 2) & 1);
                bVar18 = SUB81(uVar30 >> 3,0);
                auVar51 = vmovdqa32_avx512vl(auVar56);
                bVar13 = (bool)((byte)uVar30 & 1);
                bVar15 = (bool)((byte)(uVar30 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar30 >> 2) & 1);
                bVar19 = SUB81(uVar30 >> 3,0);
                *(uint *)&(local_1108->ptr).ptr =
                     (uint)bVar13 * auVar51._0_4_ | !bVar13 * auVar69._0_4_;
                *(uint *)((long)&(local_1108->ptr).ptr + 4) =
                     (uint)bVar15 * auVar51._4_4_ | !bVar15 * auVar69._4_4_;
                local_1108->dist = (uint)bVar17 * auVar51._8_4_ | !bVar17 * auVar69._8_4_;
                *(uint *)&local_1108->field_0xc =
                     (uint)bVar19 * auVar51._12_4_ | !bVar19 * auVar69._12_4_;
                *(uint *)&local_1108[1].ptr.ptr =
                     (uint)bVar12 * auVar54._0_4_ | (uint)!bVar12 * auVar53._0_4_;
                *(uint *)((long)&local_1108[1].ptr.ptr + 4) =
                     (uint)bVar14 * auVar54._4_4_ | (uint)!bVar14 * auVar53._4_4_;
                local_1108[1].dist = (uint)bVar16 * auVar54._8_4_ | (uint)!bVar16 * auVar53._8_4_;
                *(uint *)&local_1108[1].field_0xc =
                     (uint)bVar18 * auVar54._12_4_ | (uint)!bVar18 * auVar53._12_4_;
                local_1108 = local_1108 + 2;
              }
              else {
                lVar37 = 0;
                for (; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
                  lVar37 = lVar37 + 1;
                }
                uVar31 = tNear.field_0.i[lVar37];
                auVar66._8_8_ = 0;
                auVar66._0_8_ = *(ulong *)(uVar30 + lVar37 * 8);
                auVar60 = vpunpcklqdq_avx(auVar66,ZEXT416(uVar31));
                uVar50 = vpcmpgtd_avx512vl(auVar52,auVar51);
                uVar50 = uVar50 & 0xf;
                auVar52 = vpblendmd_avx512vl(auVar54,auVar53);
                bVar12 = (bool)((byte)uVar50 & 1);
                auVar72._0_4_ = (uint)bVar12 * auVar52._0_4_ | (uint)!bVar12 * auVar51._0_4_;
                bVar12 = (bool)((byte)(uVar50 >> 1) & 1);
                auVar72._4_4_ = (uint)bVar12 * auVar52._4_4_ | (uint)!bVar12 * auVar51._4_4_;
                bVar12 = (bool)((byte)(uVar50 >> 2) & 1);
                auVar72._8_4_ = (uint)bVar12 * auVar52._8_4_ | (uint)!bVar12 * auVar51._8_4_;
                bVar12 = SUB81(uVar50 >> 3,0);
                auVar72._12_4_ = (uint)bVar12 * auVar52._12_4_ | (uint)!bVar12 * auVar51._12_4_;
                auVar54 = vmovdqa32_avx512vl(auVar54);
                bVar12 = (bool)((byte)uVar50 & 1);
                auVar70._0_4_ = (uint)bVar12 * auVar54._0_4_ | (uint)!bVar12 * auVar53._0_4_;
                bVar12 = (bool)((byte)(uVar50 >> 1) & 1);
                auVar70._4_4_ = (uint)bVar12 * auVar54._4_4_ | (uint)!bVar12 * auVar53._4_4_;
                bVar12 = (bool)((byte)(uVar50 >> 2) & 1);
                auVar70._8_4_ = (uint)bVar12 * auVar54._8_4_ | (uint)!bVar12 * auVar53._8_4_;
                bVar12 = SUB81(uVar50 >> 3,0);
                auVar70._12_4_ = (uint)bVar12 * auVar54._12_4_ | (uint)!bVar12 * auVar53._12_4_;
                auVar65._4_4_ = uVar31;
                auVar65._0_4_ = uVar31;
                auVar65._8_4_ = uVar31;
                auVar65._12_4_ = uVar31;
                uVar50 = vpcmpgtd_avx512vl(auVar65,auVar55);
                uVar50 = uVar50 & 0xf;
                auVar53 = vpblendmd_avx512vl(auVar60,auVar73);
                bVar12 = (bool)((byte)uVar50 & 1);
                auVar61._0_4_ = (uint)bVar12 * auVar53._0_4_ | !bVar12 * uVar31;
                bVar12 = (bool)((byte)(uVar50 >> 1) & 1);
                auVar61._4_4_ = (uint)bVar12 * auVar53._4_4_ | !bVar12 * uVar31;
                bVar12 = (bool)((byte)(uVar50 >> 2) & 1);
                auVar61._8_4_ = (uint)bVar12 * auVar53._8_4_ | !bVar12 * uVar31;
                bVar12 = SUB81(uVar50 >> 3,0);
                auVar61._12_4_ = (uint)bVar12 * auVar53._12_4_ | !bVar12 * uVar31;
                auVar53 = vmovdqa32_avx512vl(auVar60);
                bVar12 = (bool)((byte)uVar50 & 1);
                auVar63._0_4_ = (uint)bVar12 * auVar53._0_4_ | (uint)!bVar12 * auVar73._0_4_;
                bVar12 = (bool)((byte)(uVar50 >> 1) & 1);
                auVar63._4_4_ = (uint)bVar12 * auVar53._4_4_ | (uint)!bVar12 * auVar73._4_4_;
                bVar12 = (bool)((byte)(uVar50 >> 2) & 1);
                auVar63._8_4_ = (uint)bVar12 * auVar53._8_4_ | (uint)!bVar12 * auVar73._8_4_;
                bVar12 = SUB81(uVar50 >> 3,0);
                auVar63._12_4_ = (uint)bVar12 * auVar53._12_4_ | (uint)!bVar12 * auVar73._12_4_;
                auVar53 = vpshufd_avx(auVar63,0xaa);
                auVar54 = vpshufd_avx(auVar70,0xaa);
                uVar50 = vpcmpgtd_avx512vl(auVar53,auVar54);
                uVar50 = uVar50 & 0xf;
                auVar54 = vpblendmd_avx512vl(auVar63,auVar70);
                bVar12 = (bool)((byte)uVar50 & 1);
                auVar64._0_4_ = (uint)bVar12 * auVar54._0_4_ | (uint)!bVar12 * auVar53._0_4_;
                bVar12 = (bool)((byte)(uVar50 >> 1) & 1);
                auVar64._4_4_ = (uint)bVar12 * auVar54._4_4_ | (uint)!bVar12 * auVar53._4_4_;
                bVar12 = (bool)((byte)(uVar50 >> 2) & 1);
                auVar64._8_4_ = (uint)bVar12 * auVar54._8_4_ | (uint)!bVar12 * auVar53._8_4_;
                bVar12 = SUB81(uVar50 >> 3,0);
                auVar64._12_4_ = (uint)bVar12 * auVar54._12_4_ | (uint)!bVar12 * auVar53._12_4_;
                auVar51 = vmovdqa32_avx512vl(auVar63);
                bVar12 = (bool)((byte)uVar50 & 1);
                bVar14 = (bool)((byte)(uVar50 >> 1) & 1);
                bVar16 = (bool)((byte)(uVar50 >> 2) & 1);
                bVar17 = SUB81(uVar50 >> 3,0);
                auVar53 = vpshufd_avx(auVar61,0xaa);
                auVar54 = vpshufd_avx(auVar72,0xaa);
                uVar30 = vpcmpgtd_avx512vl(auVar53,auVar54);
                uVar30 = uVar30 & 0xf;
                auVar54 = vpblendmd_avx512vl(auVar61,auVar72);
                bVar13 = (bool)((byte)uVar30 & 1);
                bVar15 = (bool)((byte)(uVar30 >> 1) & 1);
                uVar50 = CONCAT44((uint)bVar15 * auVar54._4_4_ | (uint)!bVar15 * auVar53._4_4_,
                                  (uint)bVar13 * auVar54._0_4_ | (uint)!bVar13 * auVar53._0_4_);
                auVar53 = vmovdqa32_avx512vl(auVar61);
                bVar13 = (bool)((byte)uVar30 & 1);
                auVar67._0_4_ = (uint)bVar13 * auVar53._0_4_ | !bVar13 * auVar72._0_4_;
                bVar13 = (bool)((byte)(uVar30 >> 1) & 1);
                auVar67._4_4_ = (uint)bVar13 * auVar53._4_4_ | !bVar13 * auVar72._4_4_;
                bVar13 = (bool)((byte)(uVar30 >> 2) & 1);
                auVar67._8_4_ = (uint)bVar13 * auVar53._8_4_ | !bVar13 * auVar72._8_4_;
                bVar13 = SUB81(uVar30 >> 3,0);
                auVar67._12_4_ = (uint)bVar13 * auVar53._12_4_ | !bVar13 * auVar72._12_4_;
                auVar53 = vpshufd_avx(auVar67,0xaa);
                auVar54 = vpshufd_avx(auVar64,0xaa);
                uVar30 = vpcmpgtd_avx512vl(auVar54,auVar53);
                uVar30 = uVar30 & 0xf;
                auVar54 = vpblendmd_avx512vl(auVar64,auVar67);
                bVar13 = (bool)((byte)uVar30 & 1);
                SVar57.ptr.ptr._0_4_ = (uint)bVar13 * auVar54._0_4_ | (uint)!bVar13 * auVar53._0_4_;
                bVar13 = (bool)((byte)(uVar30 >> 1) & 1);
                SVar57.ptr.ptr._4_4_ = (uint)bVar13 * auVar54._4_4_ | (uint)!bVar13 * auVar53._4_4_;
                bVar13 = (bool)((byte)(uVar30 >> 2) & 1);
                SVar57.dist = (uint)bVar13 * auVar54._8_4_ | (uint)!bVar13 * auVar53._8_4_;
                bVar13 = SUB81(uVar30 >> 3,0);
                SVar57._12_4_ = (uint)bVar13 * auVar54._12_4_ | (uint)!bVar13 * auVar53._12_4_;
                auVar53 = vmovdqa32_avx512vl(auVar64);
                bVar13 = (bool)((byte)uVar30 & 1);
                SVar58.ptr.ptr._0_4_ = (uint)bVar13 * auVar53._0_4_ | !bVar13 * auVar67._0_4_;
                bVar13 = (bool)((byte)(uVar30 >> 1) & 1);
                SVar58.ptr.ptr._4_4_ = (uint)bVar13 * auVar53._4_4_ | !bVar13 * auVar67._4_4_;
                bVar13 = (bool)((byte)(uVar30 >> 2) & 1);
                SVar58.dist = (uint)bVar13 * auVar53._8_4_ | !bVar13 * auVar67._8_4_;
                bVar13 = SUB81(uVar30 >> 3,0);
                SVar58._12_4_ = (uint)bVar13 * auVar53._12_4_ | !bVar13 * auVar67._12_4_;
                *(uint *)&(local_1108->ptr).ptr =
                     (uint)bVar12 * auVar51._0_4_ | !bVar12 * auVar70._0_4_;
                *(uint *)((long)&(local_1108->ptr).ptr + 4) =
                     (uint)bVar14 * auVar51._4_4_ | !bVar14 * auVar70._4_4_;
                local_1108->dist = (uint)bVar16 * auVar51._8_4_ | !bVar16 * auVar70._8_4_;
                *(uint *)&local_1108->field_0xc =
                     (uint)bVar17 * auVar51._12_4_ | !bVar17 * auVar70._12_4_;
                local_1108[1] = SVar58;
                local_1108[2] = SVar57;
                local_1108 = local_1108 + 3;
              }
            }
          }
        }
        local_1100 = (ulong)((uint)uVar50 & 0xf) - 8;
        uVar50 = uVar50 & 0xfffffffffffffff0;
        for (lVar37 = 0; lVar37 != local_1100; lVar37 = lVar37 + 1) {
          lVar33 = lVar37 * 0x50;
          local_1120 = context->scene;
          pGVar10 = (context->scene->geometries).items[*(uint *)(uVar50 + 0x30 + lVar33)].ptr;
          fVar83 = (pGVar10->time_range).lower;
          fVar83 = pGVar10->fnumTimeSegments *
                   (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar83) /
                   ((pGVar10->time_range).upper - fVar83));
          auVar53 = vroundss_avx(ZEXT416((uint)fVar83),ZEXT416((uint)fVar83),9);
          auVar53 = vminss_avx(auVar53,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
          auVar59 = vmaxss_avx512f(auVar98._0_16_,auVar53);
          lVar47 = (long)(int)auVar59._0_4_ * 0x38;
          lVar45 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar47);
          auVar53 = *(undefined1 (*) [16])(lVar45 + (ulong)*(uint *)(uVar50 + lVar33) * 4);
          uVar32 = (ulong)*(uint *)(uVar50 + 0x10 + lVar33);
          auVar54 = *(undefined1 (*) [16])(lVar45 + uVar32 * 4);
          uVar38 = CONCAT44(0,*(uint *)(uVar50 + 0x20 + lVar33));
          local_1138._0_8_ = uVar38;
          auVar51 = *(undefined1 (*) [16])(lVar45 + uVar38 * 4);
          uVar39 = CONCAT44(0,*(uint *)(uVar50 + 4 + lVar33));
          local_1148._0_8_ = uVar39;
          auVar52 = *(undefined1 (*) [16])(lVar45 + uVar39 * 4);
          uVar40 = CONCAT44(0,*(uint *)(uVar50 + 0x14 + lVar33));
          local_1158._0_8_ = uVar40;
          auVar55 = *(undefined1 (*) [16])(lVar45 + uVar40 * 4);
          uVar41 = CONCAT44(0,*(uint *)(uVar50 + 0x24 + lVar33));
          local_1168._0_8_ = uVar41;
          auVar73 = *(undefined1 (*) [16])(lVar45 + uVar41 * 4);
          uVar46 = (ulong)*(uint *)(uVar50 + 8 + lVar33);
          auVar60 = *(undefined1 (*) [16])(lVar45 + uVar46 * 4);
          uVar48 = (ulong)*(uint *)(uVar50 + 0x18 + lVar33);
          auVar62 = *(undefined1 (*) [16])(lVar45 + uVar48 * 4);
          uVar44 = (ulong)*(uint *)(uVar50 + 0x28 + lVar33);
          auVar71 = *(undefined1 (*) [16])(lVar45 + uVar44 * 4);
          uVar43 = (ulong)*(uint *)(uVar50 + 0xc + lVar33);
          auVar72 = *(undefined1 (*) [16])(lVar45 + uVar43 * 4);
          uVar42 = (ulong)*(uint *)(uVar50 + 0x1c + lVar33);
          auVar70 = *(undefined1 (*) [16])(lVar45 + uVar42 * 4);
          lVar47 = *(long *)(*(long *)&pGVar10[2].numPrimitives + 0x38 + lVar47);
          uVar30 = (ulong)*(uint *)(uVar50 + 0x2c + lVar33);
          auVar61 = *(undefined1 (*) [16])(lVar45 + uVar30 * 4);
          auVar63 = *(undefined1 (*) [16])(lVar47 + (ulong)*(uint *)(uVar50 + lVar33) * 4);
          auVar64 = *(undefined1 (*) [16])(lVar47 + uVar32 * 4);
          auVar67 = *(undefined1 (*) [16])(lVar47 + uVar38 * 4);
          auVar65 = *(undefined1 (*) [16])(lVar47 + uVar39 * 4);
          auVar66 = *(undefined1 (*) [16])(lVar47 + uVar40 * 4);
          auVar68 = *(undefined1 (*) [16])(lVar47 + uVar41 * 4);
          auVar69 = *(undefined1 (*) [16])(lVar47 + uVar46 * 4);
          auVar56 = *(undefined1 (*) [16])(lVar47 + uVar48 * 4);
          auVar3 = *(undefined1 (*) [16])(lVar47 + uVar44 * 4);
          auVar4 = *(undefined1 (*) [16])(lVar47 + uVar43 * 4);
          auVar5 = *(undefined1 (*) [16])(lVar47 + uVar42 * 4);
          auVar6 = *(undefined1 (*) [16])(lVar47 + uVar30 * 4);
          puVar1 = (undefined8 *)(uVar50 + 0x30 + lVar33);
          local_f88 = *puVar1;
          uStack_f80 = puVar1[1];
          puVar1 = (undefined8 *)(uVar50 + 0x40 + lVar33);
          auVar20 = vunpcklps_avx(auVar53,auVar60);
          auVar53 = vunpckhps_avx(auVar53,auVar60);
          auVar60 = vunpcklps_avx(auVar52,auVar72);
          auVar52 = vunpckhps_avx(auVar52,auVar72);
          auVar72 = vunpcklps_avx(auVar53,auVar52);
          auVar76 = vunpcklps_avx(auVar20,auVar60);
          auVar53 = vunpckhps_avx(auVar20,auVar60);
          auVar60 = vunpcklps_avx(auVar54,auVar62);
          auVar54 = vunpckhps_avx(auVar54,auVar62);
          auVar62 = vunpcklps_avx(auVar55,auVar70);
          auVar52 = vunpckhps_avx(auVar55,auVar70);
          auVar55 = vunpcklps_avx(auVar54,auVar52);
          auVar70 = vunpcklps_avx(auVar60,auVar62);
          auVar54 = vunpckhps_avx(auVar60,auVar62);
          auVar60 = vunpcklps_avx(auVar51,auVar71);
          auVar51 = vunpckhps_avx(auVar51,auVar71);
          auVar62 = vunpcklps_avx(auVar73,auVar61);
          auVar52 = vunpckhps_avx(auVar73,auVar61);
          auVar73 = vunpcklps_avx(auVar51,auVar52);
          auVar71 = vunpcklps_avx(auVar60,auVar62);
          auVar51 = vunpckhps_avx(auVar60,auVar62);
          auVar52 = vunpcklps_avx512vl(auVar63,auVar69);
          auVar60 = vunpckhps_avx512vl(auVar63,auVar69);
          auVar61 = vunpcklps_avx512vl(auVar65,auVar4);
          auVar62 = vunpckhps_avx512vl(auVar65,auVar4);
          auVar60 = vunpcklps_avx(auVar60,auVar62);
          auVar62 = vunpcklps_avx(auVar52,auVar61);
          auVar52 = vunpckhps_avx(auVar52,auVar61);
          auVar61 = vunpcklps_avx512vl(auVar64,auVar56);
          auVar63 = vunpckhps_avx512vl(auVar64,auVar56);
          auVar64 = vunpcklps_avx512vl(auVar66,auVar5);
          auVar65 = vunpckhps_avx512vl(auVar66,auVar5);
          auVar63 = vunpcklps_avx512vl(auVar63,auVar65);
          auVar65 = vunpcklps_avx512vl(auVar61,auVar64);
          auVar64 = vunpckhps_avx512vl(auVar61,auVar64);
          auVar66 = vunpcklps_avx512vl(auVar67,auVar3);
          auVar61 = vunpckhps_avx512vl(auVar67,auVar3);
          auVar67 = vunpcklps_avx512vl(auVar68,auVar6);
          auVar68 = vunpckhps_avx512vl(auVar68,auVar6);
          auVar61 = vunpcklps_avx(auVar61,auVar68);
          auVar68 = vunpcklps_avx512vl(auVar66,auVar67);
          auVar67 = vunpckhps_avx512vl(auVar66,auVar67);
          auVar69 = ZEXT416((uint)(fVar83 - auVar59._0_4_));
          auVar66 = vbroadcastss_avx512vl(auVar69);
          auVar69 = vsubss_avx512f(ZEXT416(0x3f800000),auVar69);
          auVar59._0_4_ = auVar69._0_4_;
          auVar59._4_4_ = auVar59._0_4_;
          auVar59._8_4_ = auVar59._0_4_;
          auVar59._12_4_ = auVar59._0_4_;
          auVar62 = vmulps_avx512vl(auVar66,auVar62);
          auVar52 = vmulps_avx512vl(auVar66,auVar52);
          auVar69 = vmulps_avx512vl(auVar66,auVar60);
          auVar60 = vfmadd231ps_fma(auVar62,auVar59,auVar76);
          auVar62 = vfmadd231ps_fma(auVar52,auVar59,auVar53);
          auVar72 = vfmadd231ps_fma(auVar69,auVar59,auVar72);
          auVar53 = vmulps_avx512vl(auVar66,auVar65);
          auVar52 = vmulps_avx512vl(auVar66,auVar64);
          auVar63 = vmulps_avx512vl(auVar66,auVar63);
          auVar53 = vfmadd231ps_fma(auVar53,auVar59,auVar70);
          auVar54 = vfmadd231ps_fma(auVar52,auVar59,auVar54);
          auVar52 = vfmadd231ps_fma(auVar63,auVar59,auVar55);
          auVar55 = vmulps_avx512vl(auVar66,auVar68);
          auVar70 = vmulps_avx512vl(auVar66,auVar67);
          auVar61 = vmulps_avx512vl(auVar66,auVar61);
          auVar55 = vfmadd231ps_fma(auVar55,auVar59,auVar71);
          auVar71 = vfmadd231ps_fma(auVar70,auVar59,auVar51);
          auVar73 = vfmadd231ps_fma(auVar61,auVar59,auVar73);
          local_1078 = *puVar1;
          uStack_1070 = puVar1[1];
          auVar53 = vsubps_avx(auVar60,auVar53);
          auVar54 = vsubps_avx(auVar62,auVar54);
          auVar51 = vsubps_avx(auVar72,auVar52);
          auVar52 = vsubps_avx(auVar55,auVar60);
          auVar55 = vsubps_avx(auVar71,auVar62);
          auVar73 = vsubps_avx(auVar73,auVar72);
          auVar76._0_4_ = auVar73._0_4_ * auVar54._0_4_;
          auVar76._4_4_ = auVar73._4_4_ * auVar54._4_4_;
          auVar76._8_4_ = auVar73._8_4_ * auVar54._8_4_;
          auVar76._12_4_ = auVar73._12_4_ * auVar54._12_4_;
          local_fe8 = vfmsub231ps_fma(auVar76,auVar55,auVar51);
          auVar80._0_4_ = auVar51._0_4_ * auVar52._0_4_;
          auVar80._4_4_ = auVar51._4_4_ * auVar52._4_4_;
          auVar80._8_4_ = auVar51._8_4_ * auVar52._8_4_;
          auVar80._12_4_ = auVar51._12_4_ * auVar52._12_4_;
          local_fd8 = vfmsub231ps_fma(auVar80,auVar73,auVar53);
          auVar82._0_4_ = auVar53._0_4_ * auVar55._0_4_;
          auVar82._4_4_ = auVar53._4_4_ * auVar55._4_4_;
          auVar82._8_4_ = auVar53._8_4_ * auVar55._8_4_;
          auVar82._12_4_ = auVar53._12_4_ * auVar55._12_4_;
          fVar83 = (ray->super_RayK<1>).dir.field_0.m128[0];
          auVar84._4_4_ = fVar83;
          auVar84._0_4_ = fVar83;
          auVar84._8_4_ = fVar83;
          auVar84._12_4_ = fVar83;
          auVar71 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]));
          auVar70 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]));
          uVar88 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar3._4_4_ = uVar88;
          auVar3._0_4_ = uVar88;
          auVar3._8_4_ = uVar88;
          auVar3._12_4_ = uVar88;
          auVar61 = vsubps_avx512vl(auVar60,auVar3);
          local_fc8 = vfmsub231ps_fma(auVar82,auVar52,auVar54);
          uVar88 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar4._4_4_ = uVar88;
          auVar4._0_4_ = uVar88;
          auVar4._8_4_ = uVar88;
          auVar4._12_4_ = uVar88;
          auVar62 = vsubps_avx512vl(auVar62,auVar4);
          uVar88 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar5._4_4_ = uVar88;
          auVar5._0_4_ = uVar88;
          auVar5._8_4_ = uVar88;
          auVar5._12_4_ = uVar88;
          auVar72 = vsubps_avx512vl(auVar72,auVar5);
          auVar60 = vmulps_avx512vl(auVar71,auVar72);
          auVar63 = vfmsub231ps_avx512vl(auVar60,auVar62,auVar70);
          auVar60 = vmulps_avx512vl(auVar70,auVar61);
          auVar60 = vfmsub231ps_fma(auVar60,auVar72,auVar84);
          auVar97._0_4_ = fVar83 * auVar62._0_4_;
          auVar97._4_4_ = fVar83 * auVar62._4_4_;
          auVar97._8_4_ = fVar83 * auVar62._8_4_;
          auVar97._12_4_ = fVar83 * auVar62._12_4_;
          auVar64 = vfmsub231ps_avx512vl(auVar97,auVar61,auVar71);
          auVar70 = vmulps_avx512vl(local_fc8,auVar70);
          auVar71 = vfmadd231ps_avx512vl(auVar70,local_fd8,auVar71);
          auVar71 = vfmadd231ps_avx512vl(auVar71,local_fe8,auVar84);
          auVar6._8_4_ = 0x7fffffff;
          auVar6._0_8_ = 0x7fffffff7fffffff;
          auVar6._12_4_ = 0x7fffffff;
          auVar70 = vandps_avx512vl(auVar71,auVar6);
          auVar73 = vmulps_avx512vl(auVar73,auVar64);
          auVar55 = vfmadd231ps_avx512vl(auVar73,auVar60,auVar55);
          auVar52 = vfmadd231ps_avx512vl(auVar55,auVar63,auVar52);
          auVar20._8_4_ = 0x80000000;
          auVar20._0_8_ = 0x8000000080000000;
          auVar20._12_4_ = 0x80000000;
          auVar55 = vandpd_avx512vl(auVar71,auVar20);
          tNear.field_0 =
               (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vxorps_avx512vl(auVar55,auVar52);
          auVar96._0_4_ = auVar51._0_4_ * auVar64._0_4_;
          auVar96._4_4_ = auVar51._4_4_ * auVar64._4_4_;
          auVar96._8_4_ = auVar51._8_4_ * auVar64._8_4_;
          auVar96._12_4_ = auVar51._12_4_ * auVar64._12_4_;
          auVar54 = vfmadd231ps_fma(auVar96,auVar54,auVar60);
          auVar53 = vfmadd231ps_fma(auVar54,auVar53,auVar63);
          auVar89._0_4_ = (float)(auVar55._0_4_ ^ auVar53._0_4_);
          auVar89._4_4_ = (float)(auVar55._4_4_ ^ auVar53._4_4_);
          auVar89._8_4_ = (float)(auVar55._8_4_ ^ auVar53._8_4_);
          auVar89._12_4_ = (float)(auVar55._12_4_ ^ auVar53._12_4_);
          auVar53 = ZEXT816(0) << 0x20;
          uVar21 = vcmpps_avx512vl((undefined1  [16])tNear.field_0,auVar53,5);
          uVar22 = vcmpps_avx512vl(auVar89,auVar53,5);
          uVar23 = vcmpps_avx512vl(auVar71,auVar53,4);
          auVar93._0_4_ = tNear.field_0._0_4_ + auVar89._0_4_;
          auVar93._4_4_ = tNear.field_0._4_4_ + auVar89._4_4_;
          auVar93._8_4_ = tNear.field_0._8_4_ + auVar89._8_4_;
          auVar93._12_4_ = tNear.field_0._12_4_ + auVar89._12_4_;
          uVar24 = vcmpps_avx512vl(auVar93,auVar70,2);
          bVar49 = (byte)uVar21 & (byte)uVar22 & (byte)uVar23 & (byte)uVar24;
          context = local_1170;
          if (bVar49 != 0) {
            auVar91._0_4_ = auVar72._0_4_ * local_fc8._0_4_;
            auVar91._4_4_ = auVar72._4_4_ * local_fc8._4_4_;
            auVar91._8_4_ = auVar72._8_4_ * local_fc8._8_4_;
            auVar91._12_4_ = auVar72._12_4_ * local_fc8._12_4_;
            auVar53 = vfmadd213ps_fma(auVar62,local_fd8,auVar91);
            auVar53 = vfmadd213ps_fma(auVar61,local_fe8,auVar53);
            auVar90._0_4_ = (float)(auVar55._0_4_ ^ auVar53._0_4_);
            auVar90._4_4_ = (float)(auVar55._4_4_ ^ auVar53._4_4_);
            auVar90._8_4_ = (float)(auVar55._8_4_ ^ auVar53._8_4_);
            auVar90._12_4_ = (float)(auVar55._12_4_ ^ auVar53._12_4_);
            uVar88 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar25._4_4_ = uVar88;
            auVar25._0_4_ = uVar88;
            auVar25._8_4_ = uVar88;
            auVar25._12_4_ = uVar88;
            auVar53 = vmulps_avx512vl(auVar70,auVar25);
            fVar83 = (ray->super_RayK<1>).tfar;
            auVar26._4_4_ = fVar83;
            auVar26._0_4_ = fVar83;
            auVar26._8_4_ = fVar83;
            auVar26._12_4_ = fVar83;
            auVar54 = vmulps_avx512vl(auVar70,auVar26);
            uVar21 = vcmpps_avx512vl(auVar90,auVar54,2);
            uVar22 = vcmpps_avx512vl(auVar53,auVar90,1);
            bVar49 = (byte)uVar21 & (byte)uVar22 & bVar49;
            if (bVar49 != 0) {
              auVar7._0_4_ = (ray->super_RayK<1>).tfar;
              auVar7._4_4_ = (ray->super_RayK<1>).mask;
              auVar7._8_4_ = (ray->super_RayK<1>).id;
              auVar7._12_4_ = (ray->super_RayK<1>).flags;
              auVar81 = ZEXT1664(auVar7);
              uVar31 = vextractps_avx(auVar7,1);
              auVar53 = vrcp14ps_avx512vl(auVar70);
              auVar27._8_4_ = 0x3f800000;
              auVar27._0_8_ = 0x3f8000003f800000;
              auVar27._12_4_ = 0x3f800000;
              auVar54 = vfnmadd213ps_avx512vl(auVar70,auVar53,auVar27);
              auVar53 = vfmadd132ps_fma(auVar54,auVar53,auVar53);
              fVar83 = auVar53._0_4_;
              local_ff8._0_4_ = fVar83 * auVar90._0_4_;
              fVar85 = auVar53._4_4_;
              local_ff8._4_4_ = fVar85 * auVar90._4_4_;
              fVar86 = auVar53._8_4_;
              local_ff8._8_4_ = fVar86 * auVar90._8_4_;
              fVar87 = auVar53._12_4_;
              local_ff8._12_4_ = fVar87 * auVar90._12_4_;
              auVar79 = ZEXT1664(local_ff8);
              local_1018[0] = fVar83 * tNear.field_0._0_4_;
              local_1018[1] = fVar85 * tNear.field_0._4_4_;
              local_1018[2] = fVar86 * tNear.field_0._8_4_;
              local_1018[3] = fVar87 * tNear.field_0._12_4_;
              local_1008[0] = fVar83 * auVar89._0_4_;
              local_1008[1] = fVar85 * auVar89._4_4_;
              local_1008[2] = fVar86 * auVar89._8_4_;
              local_1008[3] = fVar87 * auVar89._12_4_;
              auVar77._8_4_ = 0x7f800000;
              auVar77._0_8_ = 0x7f8000007f800000;
              auVar77._12_4_ = 0x7f800000;
              auVar53 = vblendmps_avx512vl(auVar77,local_ff8);
              auVar74._0_4_ =
                   (uint)(bVar49 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar49 & 1) * 0x7f800000;
              bVar12 = (bool)(bVar49 >> 1 & 1);
              auVar74._4_4_ = (uint)bVar12 * auVar53._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar49 >> 2 & 1);
              auVar74._8_4_ = (uint)bVar12 * auVar53._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(bVar49 >> 3 & 1);
              auVar74._12_4_ = (uint)bVar12 * auVar53._12_4_ | (uint)!bVar12 * 0x7f800000;
              auVar53 = vshufps_avx(auVar74,auVar74,0xb1);
              auVar53 = vminps_avx(auVar53,auVar74);
              auVar54 = vshufpd_avx(auVar53,auVar53,1);
              auVar53 = vminps_avx(auVar54,auVar53);
              uVar21 = vcmpps_avx512vl(auVar74,auVar53,0);
              bVar35 = (byte)uVar21 & bVar49;
              do {
                auVar53 = auVar98._0_16_;
                bVar34 = bVar49;
                if (bVar35 != 0) {
                  bVar34 = bVar35;
                }
                uVar9 = 0;
                for (uVar36 = (uint)bVar34; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x80000000) {
                  uVar9 = uVar9 + 1;
                }
                h.geomID = *(uint *)((long)&local_f88 + (ulong)uVar9 * 4);
                local_1128 = (local_1120->geometries).items[h.geomID].ptr;
                if ((local_1128->mask & uVar31) == 0) {
                  bVar49 = ~(byte)(1 << (uVar9 & 0x1f)) & bVar49;
                }
                else {
                  pRVar11 = context->args;
                  auVar54 = auVar79._0_16_;
                  auVar73 = auVar102._0_16_;
                  auVar55 = auVar101._0_16_;
                  auVar52 = auVar100._0_16_;
                  auVar51 = auVar99._0_16_;
                  if (pRVar11->filter == (RTCFilterFunctionN)0x0) {
                    args.context = context->user;
                    if (local_1128->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      uVar30 = (ulong)(uVar9 << 2);
                      fVar83 = *(float *)((long)local_1018 + uVar30);
                      fVar85 = *(float *)((long)local_1008 + uVar30);
                      (ray->super_RayK<1>).tfar = *(float *)(local_ff8 + uVar30);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_fe8 + uVar30);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_fd8 + uVar30);
                      (ray->Ng).field_0.field_0.z = *(float *)(local_fc8 + uVar30);
                      ray->u = fVar83;
                      ray->v = fVar85;
                      ray->primID = *(uint *)((long)&local_1078 + uVar30);
                      ray->geomID = h.geomID;
                      ray->instID[0] = (args.context)->instID[0];
                      ray->instPrimID[0] = (args.context)->instPrimID[0];
                      break;
                    }
                    local_1168 = auVar73;
                    local_1158 = auVar55;
                    local_1148 = auVar52;
                    local_1138 = auVar51;
                  }
                  else {
                    local_1168 = auVar73;
                    local_1158 = auVar55;
                    local_1148 = auVar52;
                    local_1138 = auVar51;
                    args.context = context->user;
                  }
                  uVar30 = (ulong)(uVar9 * 4);
                  h.Ng.field_0.field_0.x = *(float *)(local_fe8 + uVar30);
                  h.Ng.field_0.field_0.y = *(float *)(local_fd8 + uVar30);
                  h.Ng.field_0.field_0.z = *(float *)(local_fc8 + uVar30);
                  h.u = *(float *)((long)local_1018 + uVar30);
                  h.v = *(float *)((long)local_1008 + uVar30);
                  h.primID = *(uint *)((long)&local_1078 + uVar30);
                  h.instID[0] = (args.context)->instID[0];
                  h.instPrimID[0] = (args.context)->instPrimID[0];
                  (ray->super_RayK<1>).tfar = *(float *)(local_ff8 + uVar30);
                  local_1174 = -1;
                  args.valid = &local_1174;
                  args.geometryUserPtr = local_1128->userPtr;
                  args.ray = (RTCRayN *)ray;
                  args.hit = (RTCHitN *)&h;
                  args.N = 1;
                  local_1168 = auVar73;
                  local_1158 = auVar55;
                  local_1148 = auVar52;
                  local_1138 = auVar51;
                  if (((local_1128->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                      ((*local_1128->intersectionFilterN)(&args), *args.valid != 0)) &&
                     ((pRVar11->filter == (RTCFilterFunctionN)0x0 ||
                      ((((pRVar11->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        (((local_1128->field_8).field_0x2 & 0x40) == 0)) ||
                       ((*pRVar11->filter)(&args), *args.valid != 0)))))) {
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    *(undefined4 *)(args.ray + 0x4c) = *(undefined4 *)(args.hit + 0x1c);
                    *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
                  }
                  else {
                    local_1098 = auVar81._0_4_;
                    (ray->super_RayK<1>).tfar = local_1098;
                  }
                  auVar8._0_4_ = (ray->super_RayK<1>).tfar;
                  auVar8._4_4_ = (ray->super_RayK<1>).mask;
                  auVar8._8_4_ = (ray->super_RayK<1>).id;
                  auVar8._12_4_ = (ray->super_RayK<1>).flags;
                  auVar81 = ZEXT1664(auVar8);
                  auVar79 = ZEXT1664(auVar54);
                  fVar83 = (ray->super_RayK<1>).tfar;
                  auVar28._4_4_ = fVar83;
                  auVar28._0_4_ = fVar83;
                  auVar28._8_4_ = fVar83;
                  auVar28._12_4_ = fVar83;
                  uVar21 = vcmpps_avx512vl(auVar54,auVar28,2);
                  bVar49 = ~(byte)(1 << (uVar9 & 0x1f)) & bVar49 & (byte)uVar21;
                  uVar31 = vextractps_avx(auVar8,1);
                  auVar53 = vxorps_avx512vl(auVar53,auVar53);
                  auVar98 = ZEXT1664(auVar53);
                  auVar99 = ZEXT1664(local_1138);
                  auVar100 = ZEXT1664(local_1148);
                  auVar101 = ZEXT1664(local_1158);
                  auVar102 = ZEXT1664(local_1168);
                  context = local_1170;
                }
                if (bVar49 == 0) break;
                auVar78._8_4_ = 0x7f800000;
                auVar78._0_8_ = 0x7f8000007f800000;
                auVar78._12_4_ = 0x7f800000;
                auVar53 = vblendmps_avx512vl(auVar78,auVar79._0_16_);
                auVar75._0_4_ =
                     (uint)(bVar49 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar49 & 1) * 0x7f800000;
                bVar12 = (bool)(bVar49 >> 1 & 1);
                auVar75._4_4_ = (uint)bVar12 * auVar53._4_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)(bVar49 >> 2 & 1);
                auVar75._8_4_ = (uint)bVar12 * auVar53._8_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)(bVar49 >> 3 & 1);
                auVar75._12_4_ = (uint)bVar12 * auVar53._12_4_ | (uint)!bVar12 * 0x7f800000;
                auVar53 = vshufps_avx(auVar75,auVar75,0xb1);
                auVar53 = vminps_avx(auVar53,auVar75);
                auVar54 = vshufpd_avx(auVar53,auVar53,1);
                auVar53 = vminps_avx(auVar54,auVar53);
                uVar21 = vcmpps_avx512vl(auVar75,auVar53,0);
                bVar35 = (byte)uVar21 & bVar49;
              } while( true );
            }
          }
          auVar92 = ZEXT1664(local_f98);
          auVar94 = ZEXT1664(local_fa8);
          auVar95 = ZEXT1664(local_fb8);
          lVar45 = local_1110;
          lVar47 = local_1118;
        }
        fVar83 = (ray->super_RayK<1>).tfar;
        auVar79 = ZEXT1664(CONCAT412(fVar83,CONCAT48(fVar83,CONCAT44(fVar83,fVar83))));
        auVar81 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
      }
      goto LAB_01bd7625;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }